

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O0

void cos1D_train<IMLE>(IMLE *imleObj,int nTrain)

{
  ostream *poVar1;
  Scalar *pSVar2;
  int in_ESI;
  result_type_conflict rVar3;
  double dVar4;
  int k;
  Vec x;
  Vec z;
  normal_distribution<double> normal;
  uniform_01<double,_double> uniform;
  mt19937 rng;
  Scal NOISE_X;
  Scal NOISE_Z;
  Index in_stack_fffffffffffff538;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffff540;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  *in_stack_fffffffffffff548;
  normal_distribution<double> *in_stack_fffffffffffff550;
  int local_a50;
  double local_a10;
  double local_a08;
  normal_distribution<double> local_a00;
  uniform_01<double,_double> local_9e9 [665];
  X *in_stack_fffffffffffff8b0;
  Z *in_stack_fffffffffffff8b8;
  IMLE *in_stack_fffffffffffff8c0;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
              *)0x2ea017);
  boost::random::uniform_01<double,_double>::uniform_01(local_9e9);
  local_a08 = 0.0;
  local_a10 = 1.0;
  boost::random::normal_distribution<double>::normal_distribution(&local_a00,&local_a08,&local_a10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff550,
             (int *)in_stack_fffffffffffff548);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff550,
             (int *)in_stack_fffffffffffff548);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Training, y = cos(x), ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1," training points ---");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  *pSVar2 = 0.0;
  for (local_a50 = 0; local_a50 < in_ESI; local_a50 = local_a50 + 1) {
    rVar3 = boost::random::detail::new_uniform_01<double>::operator()
                      ((new_uniform_01<double> *)in_stack_fffffffffffff550,in_stack_fffffffffffff548
                      );
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    *pSVar2 = rVar3 * 0.02 + *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    dVar4 = cos(*pSVar2);
    rVar3 = boost::random::normal_distribution<double>::operator()
                      (in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    *pSVar2 = rVar3 * 0.1 + dVar4;
    IMLE::update(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
    in_stack_fffffffffffff550 =
         (normal_distribution<double> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                   (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    if (in_stack_fffffffffffff550->_mean <= 12.566370614359172) {
      in_stack_fffffffffffff540 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
      *(double *)in_stack_fffffffffffff540 = *(double *)in_stack_fffffffffffff540 + 0.1;
    }
    else {
      in_stack_fffffffffffff548 =
           (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
            *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        (in_stack_fffffffffffff540,in_stack_fffffffffffff538);
      *(Scalar *)in_stack_fffffffffffff548->x = 0.0;
    }
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2ea31b);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2ea32a);
  return;
}

Assistant:

void cos1D_train( Learner &imleObj, int nTrain = 2000)
{
    // Noise model
    const Scal NOISE_Z = 0.02;
    const Scal NOISE_X = 0.1;
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    boost::normal_distribution<Scal> normal;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Training
    cout << "\t --- Training, y = cos(x), " << nTrain << " training points ---" << endl;
    z[0] = 0.0;
    for(int k = 0; k < nTrain; k++)
    {
        z[0] += uniform(rng) * NOISE_Z;
        x[0] = cos(z[0]) + NOISE_X * normal(rng);

        imleObj.update(z,x);

        if( z[0] > 4*M_PI )
            z[0] = 0.0;
        else
            z[0] += 0.1;
    }
}